

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O3

void deblock_edge_luma_hor(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  pel *ppVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  pel *ppVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  pel pVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  pel *ppVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint local_b0;
  
  uVar22 = (ulong)((~edge_flag & 1U) << 2);
  ppVar1 = src + uVar22;
  lVar20 = (long)stride;
  lVar15 = (long)(stride * 2);
  iVar16 = Beta + 3;
  if (-1 < Beta) {
    iVar16 = Beta;
  }
  lVar9 = uVar22 - (long)(stride * 3);
  lVar10 = uVar22 - lVar15;
  lVar11 = uVar22 - lVar20;
  lVar23 = 0;
  ppVar8 = ppVar1;
  do {
    bVar2 = src[lVar23 + lVar9];
    bVar3 = src[lVar23 + lVar10];
    bVar4 = src[lVar23 + lVar11];
    uVar29 = (uint)bVar4;
    bVar5 = ppVar1[lVar23];
    uVar18 = (uint)bVar5;
    bVar6 = src[lVar23 + uVar22 + lVar20];
    bVar7 = src[lVar23 + uVar22 + lVar15];
    uVar24 = (uint)bVar5 - (uint)bVar4;
    uVar21 = -uVar24;
    if (0 < (int)uVar24) {
      uVar21 = uVar24;
    }
    uVar25 = (uint)bVar3 - (uint)bVar4;
    uVar24 = -uVar25;
    if (0 < (int)uVar25) {
      uVar24 = uVar25;
    }
    uVar26 = (uint)bVar5 - (uint)bVar6;
    uVar25 = -uVar26;
    if (0 < (int)uVar26) {
      uVar25 = uVar26;
    }
    uVar30 = (uint)bVar4;
    uVar28 = bVar2 - uVar30;
    uVar26 = -uVar28;
    if (0 < (int)uVar28) {
      uVar26 = uVar28;
    }
    uVar19 = (uint)bVar5;
    uVar13 = uVar18 - bVar7;
    uVar28 = -uVar13;
    if (0 < (int)uVar13) {
      uVar28 = uVar13;
    }
    iVar14 = (uint)((int)(uVar26 & 0xff) < Beta) + (uint)((int)(uVar24 & 0xff) < Beta) * 2;
    iVar27 = iVar14 + (uint)((int)(uVar25 & 0xff) < Beta) * 2 + (uint)((int)(uVar28 & 0xff) < Beta);
    if (iVar27 - 3U < 4) {
      ppVar17 = ppVar1 + lVar23;
      uVar24 = (uint)bVar5;
      uVar26 = (uint)bVar3;
      switch(iVar27) {
      case 3:
        local_b0 = (uint)bVar6;
        iVar27 = uVar26 - local_b0;
        iVar14 = -iVar27;
        if (0 < iVar27) {
          iVar14 = iVar27;
        }
        if (Beta <= iVar14) goto LAB_00114ef4;
LAB_00114ecf:
        src[lVar23 + lVar11] = (pel)(uVar29 * 3 + uVar24 + 2 >> 2);
        pVar12 = (pel)(uVar29 + uVar18 * 3 + 2 >> 2);
        goto LAB_00114ef1;
      case 4:
        if (iVar14 != 2) goto LAB_00114ecf;
        break;
      case 5:
        if ((bVar6 == bVar5) && (bVar4 == bVar3)) goto LAB_00114e11;
        break;
      case 6:
        if ((int)(uVar25 & 0xff) <= iVar16 >> 2) {
          uVar28 = uVar30 - bVar3;
          uVar25 = -uVar28;
          if (0 < (int)uVar28) {
            uVar25 = uVar28;
          }
          if ((uVar25 <= (uint)(iVar16 >> 2)) && ((int)(uVar21 & 0xff) < Alpha)) {
            bVar4 = src[lVar23 + uVar22 + (long)(stride * 3)];
            iVar14 = (uint)bVar2 + (uint)bVar3;
            src[lVar23 + lVar9] =
                 (pel)(uVar29 + ((uint)src[lVar23 + (long)(stride * -4) + uVar22] + iVar14) * 2 +
                       uVar19 + 4 >> 3);
            src[lVar23 + lVar10] = (pel)(uVar18 * 3 + uVar26 + (iVar14 + uVar30) * 4 + 8 >> 4);
            uVar21 = (uint)bVar6;
            iVar14 = uVar30 + uVar19;
            src[lVar23 + lVar11] =
                 (pel)((bVar2 + uVar21) * 3 + (iVar14 + (uint)bVar3) * 8 + uVar29 * 2 + 0x10 >> 5);
            uVar24 = (uint)bVar7;
            *ppVar17 = (pel)((uVar26 + uVar24) * 3 + (iVar14 + uVar21) * 8 + uVar18 * 2 + 0x10 >> 5)
            ;
            src[lVar23 + uVar22 + lVar20] =
                 (pel)(uVar29 * 3 + (uint)bVar6 + (uVar19 + uVar21 + uVar24) * 4 + 8 >> 4);
            ppVar17 = ppVar8 + lVar15;
            pVar12 = (pel)(iVar14 + (uVar24 + bVar6 + (uint)bVar4) * 2 + 4 >> 3);
            goto LAB_00114ef1;
          }
        }
LAB_00114e11:
        src[lVar23 + lVar10] =
             (pel)((uint)bVar2 * 3 + (uint)bVar4 * 4 + 8 + (uint)bVar3 * 8 + uVar24 >> 4);
        src[lVar23 + lVar11] =
             (pel)((uint)bVar2 + (uint)bVar3 * 4 + (uint)bVar4 * 4 + 8 + (uint)bVar4 * 2 +
                   (uint)bVar5 * 4 + (uint)bVar6 >> 4);
        *ppVar17 = (pel)(bVar3 + 8 + uVar29 * 4 + uVar18 * 6 + (uint)bVar6 * 4 + (uint)bVar7 >> 4);
        ppVar17 = ppVar8 + lVar20;
        iVar14 = uVar29 + uVar18 * 4 + (uint)bVar6 * 8 + (uint)bVar7 + (uint)bVar7 * 2;
        goto LAB_00114eca;
      }
      src[lVar23 + lVar11] =
           (pel)((uint)bVar3 + (uint)bVar3 * 2 + uVar24 + uVar29 * 10 + uVar18 * 2 + 8 >> 4);
      iVar14 = uVar29 * 3 + uVar18 * 10 + (uint)bVar6 * 3;
LAB_00114eca:
      pVar12 = (pel)(iVar14 + 8U >> 4);
LAB_00114ef1:
      *ppVar17 = pVar12;
    }
LAB_00114ef4:
    ppVar8 = ppVar8 + 1;
    lVar23 = lVar23 + 1;
    if ((uint)((~edge_flag & 0x101U) == 0) * 4 + 4 == (int)lVar23) {
      return;
    }
  } while( true );
}

Assistant:

void deblock_edge_luma_hor(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc + inc3;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4;
    }

    for (i = 0; i < line_size; i++, src++) {
        int L3 = src[-inc4];
        int L2 = src[-inc3];
        int L1 = src[-inc2];
        int L0 = src[-inc];
        int R0 = src[0];
        int R1 = src[inc];
        int R2 = src[inc2];
        int R3 = src[inc3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-inc3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                         //L2
            src[-inc2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                     //L1
            src[-inc ] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);      //L0
            src[ 0   ] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);      //R0
            src[ inc ] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                     //R1
            src[ inc2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                         //R2
            break;
        case 3:
            src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-inc ] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0   ] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ inc ] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R2
            break;
        case 2:
            src[-inc] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-inc] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}